

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lzham_vector.h
# Opt level: O2

bool __thiscall lzham::vector<unsigned_char>::try_push_back(vector<unsigned_char> *this,uchar *obj)

{
  bool bVar1;
  uint uVar2;
  
  uVar2 = this->m_size;
  if (this->m_capacity <= uVar2) {
    bVar1 = increase_capacity(this,uVar2 + 1,true,true);
    if (!bVar1) {
      return false;
    }
    uVar2 = this->m_size;
  }
  this->m_p[uVar2] = *obj;
  this->m_size = this->m_size + 1;
  return true;
}

Assistant:

inline bool try_push_back(const T& obj)
      {
         LZHAM_ASSERT(!m_p || (&obj < m_p) || (&obj >= (m_p + m_size)));

         if (m_size >= m_capacity)
         {
            if (!increase_capacity(m_size + 1, true, true))
               return false;
         }

         scalar_type<T>::construct(m_p + m_size, obj);
         m_size++;

         return true;
      }